

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

Client capnp::_::anon_unknown_0::getPersistentCap
                 (RpcSystem<capnp::rpc::twoparty::VatId> *client,Side side,Tag tag)

{
  Reader hostId_00;
  Reader objectId;
  Disposer *extraout_RAX;
  ClientHook *extraout_RDX;
  Client CVar1;
  Builder hostId;
  MallocMessageBuilder objectIdMessage;
  MallocMessageBuilder hostIdMessage;
  StructBuilder local_2e0;
  Builder local_2b8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  StructBuilder local_250;
  PointerBuilder local_228;
  MallocMessageBuilder local_208;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,8,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2e0,&local_110.super_MessageBuilder);
  local_208.super_MessageBuilder.arenaSpace[1] = local_2e0.data;
  local_208.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_2e0.segment;
  local_208.super_MessageBuilder.arenaSpace[0] = local_2e0.capTable;
  PointerBuilder::initStruct(&local_250,(PointerBuilder *)&local_208,(StructSize)0x1);
  *(undefined2 *)local_250.data = 0;
  MallocMessageBuilder::MallocMessageBuilder(&local_208,8,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_2b8,&local_208.super_MessageBuilder);
  local_228.pointer = local_2b8.builder.pointer;
  local_228.segment = local_2b8.builder.segment;
  local_228.capTable = local_2b8.builder.capTable;
  PointerBuilder::initStruct(&local_2e0,&local_228,(StructSize)0x1);
  *(Tag *)local_2e0.data = tag;
  StructBuilder::asReader(&local_250);
  MessageBuilder::getRootInternal((Builder *)&local_2e0,&local_208.super_MessageBuilder);
  PointerBuilder::asReader((PointerBuilder *)&local_2e0);
  hostId_00._reader.capTable = (CapTableReader *)uStack_278;
  hostId_00._reader.segment = (SegmentReader *)local_280;
  hostId_00._reader.data = (void *)local_270;
  hostId_00._reader.pointers = (WirePointer *)uStack_268;
  hostId_00._reader.dataSize = (undefined4)local_260;
  hostId_00._reader.pointerCount = local_260._4_2_;
  hostId_00._reader._38_2_ = local_260._6_2_;
  hostId_00._reader._40_8_ = uStack_258;
  objectId.reader.capTable = (CapTableReader *)uStack_298;
  objectId.reader.segment = (SegmentReader *)local_2a0;
  objectId.reader.pointer = (WirePointer *)local_290;
  objectId.reader._24_8_ = uStack_288;
  RpcSystemBase::baseRestore(&client->super_RpcSystemBase,hostId_00,objectId);
  MallocMessageBuilder::~MallocMessageBuilder(&local_208);
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  CVar1.hook.ptr = extraout_RDX;
  CVar1.hook.disposer = extraout_RAX;
  return (Client)CVar1.hook;
}

Assistant:

Capability::Client getPersistentCap(RpcSystem<rpc::twoparty::VatId>& client,
                                    rpc::twoparty::Side side,
                                    test::TestSturdyRefObjectId::Tag tag) {
  // Create the VatId.
  MallocMessageBuilder hostIdMessage(8);
  auto hostId = hostIdMessage.initRoot<rpc::twoparty::VatId>();
  hostId.setSide(side);

  // Create the SturdyRefObjectId.
  MallocMessageBuilder objectIdMessage(8);
  objectIdMessage.initRoot<test::TestSturdyRefObjectId>().setTag(tag);

  // Connect to the remote capability.
  return client.restore(hostId, objectIdMessage.getRoot<AnyPointer>());
}